

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_codeptr.cpp
# Opt level: O2

int AF_A_Explode(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  TObjPtr<AActor> *obj;
  VM_UBYTE VVar1;
  DObject *this;
  bool bVar2;
  PClassActor *pufftype;
  PClass *pPVar3;
  AActor *pAVar4;
  char *pcVar5;
  int iVar6;
  AActor *bombspot;
  int iVar7;
  bool bVar8;
  double dVar9;
  int local_84;
  int local_7c;
  int local_78;
  uint local_74;
  int local_70;
  int local_6c;
  FName local_64;
  double local_60;
  VMReturn *local_58;
  double local_50;
  DAngle local_48;
  DAngle local_40;
  FName local_34;
  
  if (numparam < 1) {
    pcVar5 = "(paramnum) < numparam";
    goto LAB_005b3571;
  }
  if ((param->field_0).field_3.Type != '\x03') goto LAB_005b3561;
  bombspot = *(AActor **)&param->field_0;
  if ((param->field_0).field_1.atag == 1) {
    if (bombspot == (AActor *)0x0) goto LAB_005b3076;
    bVar2 = DObject::IsKindOf((DObject *)bombspot,AActor::RegistrationInfo.MyClass);
    if (!bVar2) {
      pcVar5 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_005b3571;
    }
  }
  else {
    if (bombspot != (AActor *)0x0) goto LAB_005b3561;
LAB_005b3076:
    bombspot = (AActor *)0x0;
  }
  local_78 = -1;
  local_70 = 10;
  local_74 = 1;
  local_58 = ret;
  if (numparam == 1) {
LAB_005b3137:
    local_7c = -1;
LAB_005b313b:
    local_84 = 0;
    bVar2 = false;
LAB_005b3143:
    iVar7 = 0;
  }
  else {
    VVar1 = param[1].field_0.field_3.Type;
    if (VVar1 != 0xff) {
      if (VVar1 != '\x03') {
LAB_005b3561:
        pcVar5 = 
        "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
        ;
        goto LAB_005b3571;
      }
      this = (DObject *)param[1].field_0.field_1.a;
      if (param[1].field_0.field_1.atag == 1) {
        if ((this != (DObject *)0x0) &&
           (bVar2 = DObject::IsKindOf(this,AActor::RegistrationInfo.MyClass), !bVar2)) {
          pcVar5 = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_005b3571;
        }
      }
      else if (this != (DObject *)0x0) goto LAB_005b3561;
    }
    if ((uint)numparam < 3) goto LAB_005b3137;
    VVar1 = param[2].field_0.field_3.Type;
    if ((VVar1 != 0xff) &&
       ((VVar1 != '\x03' ||
        ((param[2].field_0.field_1.atag != 8 && (param[2].field_0.field_1.a != (void *)0x0)))))) {
      pcVar5 = 
      "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
      ;
LAB_005b3571:
      __assert_fail(pcVar5,
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                    ,0x568,"int AF_A_Explode(VMFrameStack *, VMValue *, int, VMReturn *, int)");
    }
    if (numparam == 3) goto LAB_005b3137;
    VVar1 = param[3].field_0.field_3.Type;
    local_7c = -1;
    if (VVar1 == '\0') {
      local_78 = param[3].field_0.i;
    }
    else {
      local_78 = local_7c;
      if (VVar1 != 0xff) {
        __assert_fail("param[paramnum].Type == REGT_INT",
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                      ,0x569,"int AF_A_Explode(VMFrameStack *, VMValue *, int, VMReturn *, int)");
      }
    }
    if ((uint)numparam < 5) goto LAB_005b313b;
    VVar1 = param[4].field_0.field_3.Type;
    if (VVar1 == '\0') {
      local_7c = param[4].field_0.i;
    }
    else {
      if (VVar1 != 0xff) {
        __assert_fail("param[paramnum].Type == REGT_INT",
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                      ,0x56a,"int AF_A_Explode(VMFrameStack *, VMValue *, int, VMReturn *, int)");
      }
      local_7c = -1;
    }
    if (numparam == 5) goto LAB_005b313b;
    VVar1 = param[5].field_0.field_3.Type;
    if (VVar1 == '\0') {
      local_74 = param[5].field_0.i;
    }
    else {
      if (VVar1 != 0xff) {
        __assert_fail("param[paramnum].Type == REGT_INT",
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                      ,0x56b,"int AF_A_Explode(VMFrameStack *, VMValue *, int, VMReturn *, int)");
      }
      local_74 = 1;
    }
    if ((uint)numparam < 7) goto LAB_005b313b;
    VVar1 = param[6].field_0.field_3.Type;
    if (VVar1 == '\0') {
      bVar2 = param[6].field_0.i != 0;
    }
    else {
      if (VVar1 != 0xff) {
        __assert_fail("param[paramnum].Type == REGT_INT",
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                      ,0x56c,"int AF_A_Explode(VMFrameStack *, VMValue *, int, VMReturn *, int)");
      }
      bVar2 = false;
    }
    if (numparam == 7) {
      local_84 = 0;
      goto LAB_005b3143;
    }
    VVar1 = param[7].field_0.field_3.Type;
    if (VVar1 == '\0') {
      local_84 = param[7].field_0.i;
    }
    else {
      local_84 = 0;
      if (VVar1 != 0xff) {
        __assert_fail("param[paramnum].Type == REGT_INT",
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                      ,0x56d,"int AF_A_Explode(VMFrameStack *, VMValue *, int, VMReturn *, int)");
      }
    }
    if ((uint)numparam < 9) goto LAB_005b3143;
    VVar1 = param[8].field_0.field_3.Type;
    if (VVar1 == '\0') {
      iVar7 = param[8].field_0.i;
    }
    else {
      iVar7 = 0;
      if (VVar1 != 0xff) {
        __assert_fail("param[paramnum].Type == REGT_INT",
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                      ,0x56e,"int AF_A_Explode(VMFrameStack *, VMValue *, int, VMReturn *, int)");
      }
    }
    if (numparam != 9) {
      VVar1 = param[9].field_0.field_3.Type;
      if (VVar1 == '\0') {
        local_70 = param[9].field_0.i;
      }
      else {
        if (VVar1 != 0xff) {
          __assert_fail("param[paramnum].Type == REGT_INT",
                        "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                        ,0x56f,"int AF_A_Explode(VMFrameStack *, VMValue *, int, VMReturn *, int)");
        }
        local_70 = 10;
      }
      if ((10 < (uint)numparam) && (VVar1 = param[10].field_0.field_3.Type, VVar1 != 0xff)) {
        if (VVar1 != '\x03') {
LAB_005b362d:
          pcVar5 = 
          "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
          ;
LAB_005b3634:
          __assert_fail(pcVar5,
                        "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                        ,0x570,"int AF_A_Explode(VMFrameStack *, VMValue *, int, VMReturn *, int)");
        }
        pufftype = (PClassActor *)param[10].field_0.field_1.a;
        if (param[10].field_0.field_1.atag == 1) {
          if (pufftype != (PClassActor *)0x0) {
            bVar8 = PClass::IsAncestorOf(AActor::RegistrationInfo.MyClass,(PClass *)pufftype);
            if (!bVar8) {
              pcVar5 = "pufftype == NULL || pufftype->IsDescendantOf(RUNTIME_CLASS(AActor))";
              goto LAB_005b3634;
            }
            goto LAB_005b3151;
          }
        }
        else if (pufftype != (PClassActor *)0x0) goto LAB_005b362d;
        pufftype = (PClassActor *)0x0;
        goto LAB_005b3151;
      }
    }
  }
  pufftype = PClass::FindActor(NAME_BulletPuff);
LAB_005b3151:
  local_6c = 0;
  if (0xb < (uint)numparam) {
    VVar1 = param[0xb].field_0.field_3.Type;
    if (VVar1 == '\0') {
      local_6c = param[0xb].field_0.i;
    }
    else if (VVar1 != 0xff) {
      __assert_fail("param[paramnum].Type == REGT_INT",
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                    ,0x571,"int AF_A_Explode(VMFrameStack *, VMValue *, int, VMReturn *, int)");
    }
  }
  if (local_78 < 0) {
    pPVar3 = DObject::GetClass((DObject *)bombspot);
    local_78 = *(int *)&pPVar3[1].Defaults;
    pPVar3 = DObject::GetClass((DObject *)bombspot);
    local_7c = *(int *)((long)&pPVar3[1].FlatPointers + 4);
    pPVar3 = DObject::GetClass((DObject *)bombspot);
    local_74 = *(byte *)&pPVar3[1].FlatPointers ^ 1;
    bVar2 = false;
  }
  if (local_7c < 1) {
    local_7c = local_78;
  }
  if (iVar7 != 0) {
    local_50 = (double)iVar7;
    iVar6 = 0;
    if (0 < iVar7) {
      iVar6 = iVar7;
    }
    dVar9 = 0.0;
    while (bVar8 = iVar6 != 0, iVar6 = iVar6 + -1, bVar8) {
      local_40.Degrees = (dVar9 * 360.0) / local_50;
      local_48.Degrees = 0.0;
      local_64.Index = 200;
      local_60 = dVar9;
      P_LineAttack(bombspot,&local_40,2048.0,&local_48,local_70,&local_64,pufftype,0,
                   (FTranslatedLineTarget *)0x0,(int *)0x0);
      dVar9 = local_60 + 1.0;
    }
  }
  if ((local_74 & 8) == 0 && local_6c == 0) {
    local_6c = (bombspot->DamageType).super_FName.Index;
  }
  obj = &bombspot->target;
  pAVar4 = GC::ReadBarrier<AActor>((AActor **)obj);
  local_34.Index = local_6c;
  iVar7 = P_RadiusAttack(bombspot,pAVar4,local_78,local_7c,&local_34,local_74 & 5,local_84);
  P_CheckSplash(bombspot,(double)local_7c);
  if (((bVar2) && (pAVar4 = GC::ReadBarrier<AActor>((AActor **)obj), pAVar4 != (AActor *)0x0)) &&
     (pAVar4 = GC::ReadBarrier<AActor>((AActor **)obj), pAVar4->player != (player_t *)0x0)) {
    pAVar4 = GC::ReadBarrier<AActor>((AActor **)obj);
    P_NoiseAlert(pAVar4,bombspot,false,0.0);
  }
  if (numret < 1) {
    iVar7 = 0;
  }
  else {
    if (local_58 == (VMReturn *)0x0) {
      __assert_fail("ret != NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                    ,0x59b,"int AF_A_Explode(VMFrameStack *, VMValue *, int, VMReturn *, int)");
    }
    VMReturn::SetInt(local_58,iVar7);
    iVar7 = 1;
  }
  return iVar7;
}

Assistant:

DEFINE_ACTION_FUNCTION_PARAMS(AActor, A_Explode)
{
	PARAM_ACTION_PROLOGUE;
	PARAM_INT_OPT	(damage)		   { damage = -1; }
	PARAM_INT_OPT	(distance)		   { distance = -1; }
	PARAM_INT_OPT	(flags)			   { flags = XF_HURTSOURCE; }
	PARAM_BOOL_OPT	(alert)			   { alert = false; }
	PARAM_INT_OPT	(fulldmgdistance)  { fulldmgdistance = 0; }
	PARAM_INT_OPT	(nails)			   { nails = 0; }
	PARAM_INT_OPT	(naildamage)	   { naildamage = 10; }
	PARAM_CLASS_OPT	(pufftype, AActor) { pufftype = PClass::FindActor(NAME_BulletPuff); }
	PARAM_NAME_OPT	(damagetype)		{ damagetype = NAME_None; }

	if (damage < 0)	// get parameters from metadata
	{
		damage = self->GetClass()->ExplosionDamage;
		distance = self->GetClass()->ExplosionRadius;
		flags = !self->GetClass()->DontHurtShooter;
		alert = false;
	}
	if (distance <= 0) distance = damage;

	// NailBomb effect, from SMMU but not from its source code: instead it was implemented and
	// generalized from the documentation at http://www.doomworld.com/eternity/engine/codeptrs.html

	if (nails)
	{
		DAngle ang;
		for (int i = 0; i < nails; i++)
		{
			ang = i*360./nails;
			// Comparing the results of a test wad with Eternity, it seems A_NailBomb does not aim
			P_LineAttack (self, ang, MISSILERANGE, 0.,
				//P_AimLineAttack (self, ang, MISSILERANGE), 
				naildamage, NAME_Hitscan, pufftype);
		}
	}

	if (!(flags & XF_NOACTORTYPE) && damagetype == NAME_None)
	{
		damagetype = self->DamageType;
	}

	int pflags = 0;
	if (flags & XF_HURTSOURCE)	pflags |= RADF_HURTSOURCE;
	if (flags & XF_NOTMISSILE)	pflags |= RADF_SOURCEISSPOT;

	int count = P_RadiusAttack (self, self->target, damage, distance, damagetype, pflags, fulldmgdistance);
	P_CheckSplash(self, distance);
	if (alert && self->target != NULL && self->target->player != NULL)
	{
		P_NoiseAlert(self->target, self);
	}
	ACTION_RETURN_INT(count);
}